

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_descriptor.cpp
# Opt level: O1

string * __thiscall
program_options::option_description::canonical_display_name_abi_cxx11_
          (string *__return_storage_ptr__,option_description *this,int prefix_style)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_type sVar2;
  long lVar3;
  long *plVar4;
  size_type *psVar5;
  pointer pcVar6;
  char *__lhs;
  pointer pcVar7;
  long *local_38;
  ulong local_30;
  long local_28 [2];
  
  __rhs = (this->m_long_names).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->m_long_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__rhs != pbVar1) {
    if (prefix_style == 0x1000) {
      __lhs = "-";
LAB_0014cc31:
      std::operator+(__return_storage_ptr__,__lhs,__rhs);
      return __return_storage_ptr__;
    }
    if (prefix_style == 1) {
      __lhs = "--";
      goto LAB_0014cc31;
    }
  }
  sVar2 = (this->m_short_name)._M_string_length;
  if (sVar2 == 2) {
    if (prefix_style == 4) {
      local_38 = local_28;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"-","");
      plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_38,local_30,0,'\x01');
    }
    else {
      if (prefix_style != 8) goto LAB_0014cc0f;
      local_38 = local_28;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"/","");
      plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_38,local_30,0,'\x01');
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      lVar3 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
    }
  }
  else {
LAB_0014cc0f:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (__rhs == pbVar1) {
      pcVar7 = (this->m_short_name)._M_dataplus._M_p;
      pcVar6 = pcVar7 + sVar2;
    }
    else {
      pcVar7 = (__rhs->_M_dataplus)._M_p;
      pcVar6 = pcVar7 + __rhs->_M_string_length;
    }
    std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar7,pcVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string option_description::canonical_display_name(int prefix_style) const
{
    // We prefer the first long name over any others
    if (!m_long_names.empty())
    {
        if (prefix_style == command_line_style::allow_long)
            return "--" + *m_long_names.begin();
        if (prefix_style == command_line_style::allow_long_disguise)
            return "-" + *m_long_names.begin();
    }
    // sanity check: m_short_name[0] should be '-' or '/'
    if (m_short_name.length() == 2)
    {
        if (prefix_style == command_line_style::allow_slash_for_short)
            return std::string("/") + m_short_name[1];
        if (prefix_style == command_line_style::allow_dash_for_short)
            return std::string("-") + m_short_name[1];
    }
    if (!m_long_names.empty())
        return *m_long_names.begin();
    else
        return m_short_name;
}